

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.cc
# Opt level: O0

bool el::base::utils::Str::cStringCaseEq(char *s1,char *s2)

{
  int iVar1;
  int iVar2;
  char *in_RSI;
  char *in_RDI;
  int c2;
  int c1;
  int d;
  char *local_18;
  char *local_10;
  bool local_1;
  
  if ((in_RDI == (char *)0x0) && (in_RSI == (char *)0x0)) {
    local_1 = true;
  }
  else if ((in_RDI == (char *)0x0) || (local_18 = in_RSI, local_10 = in_RDI, in_RSI == (char *)0x0))
  {
    local_1 = false;
  }
  else {
    do {
      iVar1 = toupper((int)*local_10);
      iVar2 = toupper((int)*local_18);
      if (iVar1 != iVar2) break;
      local_18 = local_18 + 1;
      local_10 = local_10 + 1;
    } while (iVar2 != 0);
    local_1 = iVar1 == iVar2;
  }
  return local_1;
}

Assistant:

bool Str::cStringCaseEq(const char* s1, const char* s2) {
  if (s1 == nullptr && s2 == nullptr) return true;
  if (s1 == nullptr || s2 == nullptr) return false;

  // With thanks to cygwin for this code
  int d = 0;

  while (true) {
    const int c1 = toupper(*s1++);
    const int c2 = toupper(*s2++);

    if (((d = c1 - c2) != 0) || (c2 == '\0')) {
      break;
    }
  }

  return d == 0;
}